

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintRegister(OutputContext *ctx,uchar value)

{
  uchar value_local;
  OutputContext *ctx_local;
  
  if (value == '\0') {
    Print(ctx,"rG");
  }
  else if (value == '\x01') {
    Print(ctx,"rF");
  }
  else if (value == '\x02') {
    Print(ctx,"rC");
  }
  else if (value == '\x03') {
    Print(ctx,"rR");
  }
  else {
    Print(ctx,"r%d",(ulong)value);
  }
  return;
}

Assistant:

void PrintRegister(OutputContext &ctx, unsigned char value)
{
	if(value == rvrrGlobals)
		Print(ctx, "rG");
	else if(value == rvrrFrame)
		Print(ctx, "rF");
	else if(value == rvrrConstants)
		Print(ctx, "rC");
	else if(value == rvrrRegisters)
		Print(ctx, "rR");
	else
		Print(ctx, "r%d", value);
}